

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

ArguDesc *
cxxopts::values::parser_tool::ParseArgument
          (ArguDesc *__return_storage_ptr__,char *arg,bool *matched)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  pointer psVar6;
  pointer psVar7;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_48;
  
  local_48.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_begin = (char *)0x0;
  local_48.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar3 = strlen(arg);
  std::__detail::
  __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
            (arg,arg + sVar3,&local_48,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_matcher_abi_cxx11_,0);
  uVar5 = ((long)local_48.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_48.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  *matched = 3 < uVar5;
  (__return_storage_ptr__->arg_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->arg_name).field_2;
  (__return_storage_ptr__->arg_name)._M_string_length = 0;
  (__return_storage_ptr__->arg_name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->grouping = false;
  __return_storage_ptr__->set_value = false;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  if (3 < uVar5) {
    psVar6 = (pointer)((long)local_48.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                      ((long)local_48.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) + -0x48);
    psVar7 = local_48.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    if (0xfffffffffffffffd < uVar5 - 5) {
      psVar7 = psVar6;
    }
    if (local_48.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar7 = psVar6;
    }
    local_68 = &local_58;
    if (psVar7->matched == true) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                 (psVar7->super_pair<const_char_*,_const_char_*>).second);
    }
    else {
      local_60 = 0;
      local_58 = 0;
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    lVar4 = (long)local_48.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar4 == 0) || (0xfffffffffffffffc < (lVar4 >> 3) * -0x5555555555555555 - 6U)) {
      psVar6 = (pointer)((long)local_48.
                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
    }
    else {
      psVar6 = local_48.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2;
    }
    pcVar1 = (psVar6->super_pair<const_char_*,_const_char_*>).second;
    pcVar2 = (psVar6->super_pair<const_char_*,_const_char_*>).first;
    __return_storage_ptr__->set_value =
         (bool)((pcVar1 != pcVar2 && -1 < (long)pcVar1 - (long)pcVar2) & psVar6->matched);
    if ((local_48.
         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_48.
         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (0xfffffffffffffffb < (lVar4 >> 3) * -0x5555555555555555 - 7U)) {
      psVar6 = (pointer)((long)local_48.
                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
    }
    else {
      psVar6 = local_48.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 3;
    }
    if (psVar6->matched == true) {
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,(psVar6->super_pair<const_char_*,_const_char_*>).first,
                 (psVar6->super_pair<const_char_*,_const_char_*>).second);
    }
    else {
      local_60 = 0;
      local_58 = 0;
      local_68 = &local_58;
    }
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,(string *)&local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    lVar4 = (long)local_48.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar4 == 0) || (0xfffffffffffffffa < (lVar4 >> 3) * -0x5555555555555555 - 8U)) {
      psVar6 = (pointer)((long)local_48.
                               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
    }
    else {
      psVar6 = local_48.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4;
    }
    if ((psVar6->matched == true) &&
       (pcVar1 = (psVar6->super_pair<const_char_*,_const_char_*>).second,
       pcVar2 = (psVar6->super_pair<const_char_*,_const_char_*>).first,
       pcVar1 != pcVar2 && -1 < (long)pcVar1 - (long)pcVar2)) {
      __return_storage_ptr__->grouping = true;
      if ((local_48.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_48.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (0xfffffffffffffffa < (lVar4 >> 3) * -0x5555555555555555 - 8U)) {
        psVar6 = (pointer)((long)local_48.
                                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
      }
      else {
        psVar6 = local_48.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4;
      }
      if (psVar6->matched == true) {
        local_68 = &local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,(psVar6->super_pair<const_char_*,_const_char_*>).first,
                   (psVar6->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_60 = 0;
        local_58 = 0;
        local_68 = &local_58;
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
    }
  }
  if (local_48.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ArguDesc ParseArgument(const char *arg, bool &matched)
{
  std::match_results<const char*> result;
  std::regex_match(arg, result, option_matcher);
  matched = !result.empty();

  ArguDesc argu_desc;
  if (matched) {
    argu_desc.arg_name = result[1].str();
    argu_desc.set_value = result[2].length() > 0;
    argu_desc.value = result[3].str();
    if (result[4].length() > 0)
    {
      argu_desc.grouping = true;
      argu_desc.arg_name = result[4].str();
    }
  }

  return argu_desc;
}